

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall
VmaBlockMetadata::PrintDetailedMap_Begin
          (VmaBlockMetadata *this,VmaJsonWriter *json,VkDeviceSize unusedBytes,
          size_t allocationCount,size_t unusedRangeCount)

{
  VmaJsonWriter::WriteString(json,"TotalBytes");
  VmaJsonWriter::WriteNumber(json,this->m_Size);
  VmaJsonWriter::WriteString(json,"UnusedBytes");
  VmaJsonWriter::WriteSize(json,unusedBytes);
  VmaJsonWriter::WriteString(json,"Allocations");
  VmaJsonWriter::WriteSize(json,allocationCount);
  VmaJsonWriter::WriteString(json,"UnusedRanges");
  VmaJsonWriter::WriteSize(json,unusedRangeCount);
  VmaJsonWriter::WriteString(json,"Suballocations");
  VmaJsonWriter::BeginArray(json,false);
  return;
}

Assistant:

void VmaBlockMetadata::PrintDetailedMap_Begin(class VmaJsonWriter& json,
    VkDeviceSize unusedBytes, size_t allocationCount, size_t unusedRangeCount) const
{
    json.WriteString("TotalBytes");
    json.WriteNumber(GetSize());

    json.WriteString("UnusedBytes");
    json.WriteSize(unusedBytes);

    json.WriteString("Allocations");
    json.WriteSize(allocationCount);

    json.WriteString("UnusedRanges");
    json.WriteSize(unusedRangeCount);

    json.WriteString("Suballocations");
    json.BeginArray();
}